

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

wchar_t * __thiscall ON_wString::ReserveArray(ON_wString *this,size_t array_capacity)

{
  __int_type _Var1;
  ON_wStringHeader *pOVar2;
  ON_wStringHeader *this_00;
  wchar_t *pwVar3;
  wchar_t *__src;
  int local_4c;
  int size;
  ON_wStringHeader *hdr1;
  ON_wStringHeader *hdr0;
  int capacity;
  size_t array_capacity_local;
  ON_wString *this_local;
  
  if (array_capacity == 0) {
    this_local = (ON_wString *)0x0;
  }
  else if (array_capacity < 0xffffffff) {
    local_4c = (int)array_capacity;
    pOVar2 = Header(this);
    if ((pOVar2 == pEmptyStringHeader) || (pOVar2 == (ON_wStringHeader *)0x0)) {
      CreateArray(this,local_4c);
    }
    else {
      _Var1 = std::__atomic_base::operator_cast_to_int((__atomic_base *)pOVar2);
      if (_Var1 < 2) {
        if (pOVar2->string_capacity < local_4c) {
          pOVar2 = (ON_wStringHeader *)onrealloc(pOVar2,(long)(local_4c + 1) * 4 + 0xc);
          pwVar3 = ON_wStringHeader::string_array(pOVar2);
          this->m_s = pwVar3;
          memset(this->m_s + pOVar2->string_capacity,0,
                 (long)((local_4c + 1) - pOVar2->string_capacity) << 2);
          pOVar2->string_capacity = local_4c;
        }
      }
      else {
        Create(this);
        CreateArray(this,local_4c);
        this_00 = Header(this);
        if (pOVar2->string_length <= local_4c) {
          local_4c = pOVar2->string_length;
        }
        if (0 < local_4c) {
          pwVar3 = ON_wStringHeader::string_array(this_00);
          __src = ON_wStringHeader::string_array(pOVar2);
          memcpy(pwVar3,__src,(long)local_4c << 2);
          this_00->string_length = local_4c;
        }
        ON_wStringHeader_DecrementRefCountAndDeleteIfZero(pOVar2);
      }
    }
    this_local = (ON_wString *)Array(this);
  }
  else {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_wstring.cpp"
               ,0x1aa,"","Requested capacity > ON_wString::MaximumStringLength");
    this_local = (ON_wString *)0x0;
  }
  return (wchar_t *)this_local;
}

Assistant:

wchar_t* ON_wString::ReserveArray( size_t array_capacity )
{
  if (array_capacity <= 0)
    return nullptr;

  if (array_capacity > (size_t)ON_wString::MaximumStringLength)
  {
    ON_ERROR("Requested capacity > ON_wString::MaximumStringLength");
    return nullptr;
  }

  const int capacity = (int)array_capacity; // for 64 bit compiler
  ON_wStringHeader* hdr0 = Header();
  if ( hdr0 == pEmptyStringHeader || nullptr == hdr0 )
  {
		CreateArray(capacity);
  }
  else if ( (int)(hdr0->ref_count) > 1 )
  {
    // Calling Create() here insures hdr0 remains valid until we decrement below.
    Create();

    // Allocate a new array
		CreateArray(capacity);
    ON_wStringHeader* hdr1 = Header();
    const int size = (capacity < hdr0->string_length) ? capacity : hdr0->string_length;
    if ( size > 0 )
    {
      memcpy( hdr1->string_array(), hdr0->string_array(), size*sizeof(*m_s) );
      hdr1->string_length = size;
    }
    // "this" no longer requires access to the original header
    // If we are in a multi-threaded situation and another thread
    // has decremented ref_count since the > 1 check above,
    // we might end up deleting hdr0.
    ON_wStringHeader_DecrementRefCountAndDeleteIfZero(hdr0);
  }
	else if ( capacity > hdr0->string_capacity )
  {
		hdr0 = (ON_wStringHeader*)onrealloc( hdr0, sizeof(ON_wStringHeader) + (capacity+1)*sizeof(*m_s) );
    m_s = hdr0->string_array();
    memset( &m_s[hdr0->string_capacity], 0, (1 + capacity - hdr0->string_capacity)*sizeof(*m_s) );
    hdr0->string_capacity = capacity;
	}
  return Array();
}